

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

bb_insn_t_conflict add_new_bb_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb,int append_p)

{
  DLIST_bb_insn_t *list;
  bb_insn_t pbVar1;
  bb_insn_t_conflict elem;
  DLIST_LINK_bb_insn_t *pDVar2;
  
  elem = create_bb_insn(gen_ctx,insn,bb);
  list = &bb->bb_insns;
  if (append_p == 0) {
    pbVar1 = list->head;
    if (pbVar1 == (bb_insn_t)0x0) {
      if ((bb->bb_insns).tail != (bb_insn_t)0x0) goto LAB_00136e14;
      pDVar2 = (DLIST_LINK_bb_insn_t *)&(bb->bb_insns).tail;
    }
    else {
      if ((pbVar1->bb_insn_link).prev != (bb_insn_t)0x0) {
LAB_00136e14:
        dlist_assert_fail("prepend","bb_insn_t");
      }
      pDVar2 = &pbVar1->bb_insn_link;
    }
    pDVar2->prev = elem;
    (elem->bb_insn_link).prev = (bb_insn_t)0x0;
    (elem->bb_insn_link).next = pbVar1;
    list->head = elem;
  }
  else {
    DLIST_bb_insn_t_append(list,elem);
  }
  return elem;
}

Assistant:

static bb_insn_t add_new_bb_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb, int append_p) {
  bb_insn_t bb_insn = create_bb_insn (gen_ctx, insn, bb);

  if (append_p)
    DLIST_APPEND (bb_insn_t, bb->bb_insns, bb_insn);
  else
    DLIST_PREPEND (bb_insn_t, bb->bb_insns, bb_insn);
  return bb_insn;
}